

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

void qpdf_register_progress_reporter
               (qpdf_data qpdf,_func_void_int_void_ptr *report_progress,void *data)

{
  QPDFWriter *this;
  FunctionProgressReporter *this_00;
  shared_ptr<QPDFWriter::ProgressReporter> sStack_68;
  function<void_(int)> local_58;
  _Bind<void_(*(std::_Placeholder<1>,_void_*))(int,_void_*)> local_38;
  
  this = (qpdf->qpdf_writer).super___shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (FunctionProgressReporter *)operator_new(0x28);
  local_38._M_f = report_progress;
  local_38._M_bound_args.super__Tuple_impl<0UL,_std::_Placeholder<1>,_void_*>.
  super__Tuple_impl<1UL,_void_*>.super__Head_base<1UL,_void_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_std::_Placeholder<1>,_void_*>)
       (_Tuple_impl<0UL,_std::_Placeholder<1>,_void_*>)data;
  std::function<void(int)>::
  function<std::_Bind<void(*(std::_Placeholder<1>,void*))(int,void*)>,void>
            ((function<void(int)> *)&local_58,&local_38);
  QPDFWriter::FunctionProgressReporter::FunctionProgressReporter(this_00,&local_58);
  std::__shared_ptr<QPDFWriter::ProgressReporter,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<QPDFWriter::FunctionProgressReporter,void>
            ((__shared_ptr<QPDFWriter::ProgressReporter,(__gnu_cxx::_Lock_policy)2> *)&sStack_68,
             this_00);
  QPDFWriter::registerProgressReporter(this,&sStack_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sStack_68.super___shared_ptr<QPDFWriter::ProgressReporter,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::_Function_base::~_Function_base(&local_58.super__Function_base);
  return;
}

Assistant:

void
qpdf_register_progress_reporter(
    qpdf_data qpdf, void (*report_progress)(int percent, void* data), void* data)
{
    QTC::TC("qpdf", "qpdf-c registered progress reporter");
    qpdf->qpdf_writer->registerProgressReporter(
        std::shared_ptr<QPDFWriter::ProgressReporter>(new QPDFWriter::FunctionProgressReporter(
            std::bind(report_progress, std::placeholders::_1, data))));
}